

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

ptr<Value> __thiscall Function::call(Function *this,ValueList *arguments)

{
  Object *this_00;
  pointer psVar1;
  element_type *peVar2;
  Environment *other;
  ThrowPacket *pTVar3;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ptr<Value> pVar7;
  ptr<Value> value;
  Environment localEnv;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  this_00 = (Object *)
            arguments[2].
            super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 == (Object *)0x0) {
    pTVar3 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&localEnv,"Function owner not set",(allocator<char> *)&value);
    ExceptionObjects::null_value((string *)&local_50.field_2);
    ThrowPacket::ThrowPacket(pTVar3,(ptr<Value> *)&local_50.field_2);
    __cxa_throw(pTVar3,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  psVar1 = (arguments->
           super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (in_RDX[1] - *in_RDX >> 4 ==
      (long)(psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi -
      (long)(psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr >> 5) {
    other = Object::getEnvironment(this_00);
    Environment::Environment(&localEnv,other);
    lVar5 = 0;
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < (ulong)(in_RDX[1] - *in_RDX >> 4); uVar4 = uVar4 + 1) {
      peVar2 = (((arguments->
                 super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> *)(*in_RDX + lVar5));
      Environment::putValue
                (&localEnv,(Identifier *)((long)&(peVar2->super_Member)._vptr_Member + lVar6),Public
                 ,(ptr<Value> *)&local_60,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      lVar6 = lVar6 + 0x20;
      lVar5 = lVar5 + 0x10;
    }
    psVar1 = arguments[1].
             super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (*(code *)(((psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Member)._vptr_Member)(psVar1,&localEnv);
    (this->super_Value).super_Member._vptr_Member = (_func_int **)0x0;
    (this->super_Callable)._vptr_Callable = (_func_int **)0x0;
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&localEnv);
    pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Value;
    return (ptr<Value>)pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  pTVar3 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&localEnv,"Invalid number of arguments",(allocator<char> *)&value);
  ExceptionObjects::call_failed(&local_50);
  ThrowPacket::ThrowPacket(pTVar3,(ptr<Value> *)&local_50);
  __cxa_throw(pTVar3,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> call(ValueList& arguments) override {
        if(!owner)
            throw ThrowPacket(ExceptionObjects::null_value("Function owner not set"));

        if(arguments.size() != parameters -> size())
            throw ThrowPacket(ExceptionObjects::call_failed("Invalid number of arguments"));

        Environment localEnv = *(owner -> getEnvironment());

        for(int i = 0; i < arguments.size(); i++)
            localEnv.putValue((*parameters)[i], Scope::Public, arguments[i], false);

        try {
            statementBlock -> execute(&localEnv);
        } catch(ptr<Value> value) {
            return value;
        }

        return nullptr;
    }